

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

int cfg_db_remove_sectiontype(cfg_db *db,char *section_type)

{
  cfg_section_type *local_60;
  cfg_section_type *section;
  char *section_type_local;
  cfg_db *db_local;
  
  local_60 = (cfg_section_type *)avl_find(&db->sectiontypes,section_type);
  if (local_60 == (cfg_section_type *)0x0) {
    local_60 = (cfg_section_type *)0x0;
  }
  if (local_60 == (cfg_section_type *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    _free_sectiontype(local_60);
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_db_remove_sectiontype(struct cfg_db *db, const char *section_type) {
  struct cfg_section_type *section;

  /* find section */
  section = cfg_db_find_sectiontype(db, section_type);
  if (section == NULL) {
    return -1;
  }

  _free_sectiontype(section);
  return 0;
}